

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isac.c
# Opt level: O0

int16_t WebRtcIsac_UpdateUplinkBw(ISACStruct *ISAC_main_inst,int16_t bweIndex)

{
  int16_t iVar1;
  int16_t returnVal;
  ISACMainStruct *instISAC;
  int16_t bweIndex_local;
  ISACStruct *ISAC_main_inst_local;
  
  if ((*(ushort *)(ISAC_main_inst + 0x538e0) & 2) == 2) {
    iVar1 = WebRtcIsac_UpdateUplinkBwImpl
                      ((BwEstimatorstr *)(ISAC_main_inst + 0x537b0),bweIndex,
                       *(IsacSamplingRate *)(ISAC_main_inst + 0x538d8));
    if (iVar1 < 0) {
      *(int16_t *)(ISAC_main_inst + 0x538d0) = -iVar1;
      ISAC_main_inst_local._6_2_ = -1;
    }
    else {
      ISAC_main_inst_local._6_2_ = 0;
    }
  }
  else {
    *(undefined2 *)(ISAC_main_inst + 0x538d0) = 0x190a;
    ISAC_main_inst_local._6_2_ = -1;
  }
  return ISAC_main_inst_local._6_2_;
}

Assistant:

int16_t WebRtcIsac_UpdateUplinkBw(ISACStruct* ISAC_main_inst,
                                  int16_t bweIndex) {
  ISACMainStruct* instISAC = (ISACMainStruct*)ISAC_main_inst;
  int16_t returnVal;

  /* Check if encoder initiated. */
  if ((instISAC->initFlag & BIT_MASK_ENC_INIT) !=
      BIT_MASK_ENC_INIT) {
    instISAC->errorCode = ISAC_ENCODER_NOT_INITIATED;
    return -1;
  }

  /* Call function to get Bandwidth Estimate. */
  returnVal = WebRtcIsac_UpdateUplinkBwImpl(
                &(instISAC->bwestimator_obj), bweIndex,
                instISAC->encoderSamplingRateKHz);

  if (returnVal < 0) {
    instISAC->errorCode = -returnVal;
    return -1;
  } else {
    return 0;
  }
}